

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int __thiscall
opengv::absolute_pose::modules::GpnpOptimizationFunctor::operator()
          (GpnpOptimizationFunctor *this,VectorXd *x,VectorXd *fvec)

{
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  long in_RDI;
  ReturnType RVar1;
  size_t j;
  size_t i_2;
  size_t index;
  Vector3d diffc;
  Vector3d diffw;
  size_t i_1;
  points_t ccam;
  size_t i;
  Matrix<double,_12,_1,_0,_12,_1> solution;
  EigenBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_3,_1,_false>_>
  *in_stack_fffffffffffffd80;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *in_stack_fffffffffffffd88;
  Index in_stack_fffffffffffffd90;
  DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *in_stack_fffffffffffffd98;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_12,_12,_0,_12,_12>,_12,_1,_true>_>_>
  *in_stack_fffffffffffffda0;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *this_01;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffda8;
  StorageBaseType *in_stack_fffffffffffffdc8;
  double *in_stack_fffffffffffffdd0;
  ulong local_208;
  ulong local_200;
  ulong local_168;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_160 [6];
  ulong local_c8;
  
  Eigen::Matrix<double,_12,_1,_0,_12,_1>::Matrix
            ((Matrix<double,_12,_1,_0,_12,_1> *)in_stack_fffffffffffffd88,
             (Matrix<double,_12,_1,_0,_12,_1> *)in_stack_fffffffffffffd80);
  for (local_c8 = 0; local_c8 < *(ulong *)(in_RDI + 0x20); local_c8 = local_c8 + 1) {
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
              (in_stack_fffffffffffffd88,(Index)in_stack_fffffffffffffd80);
    Eigen::DenseBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>::col
              ((DenseBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_> *)in_stack_fffffffffffffd98,
               in_stack_fffffffffffffd90);
    Eigen::operator*(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)in_stack_fffffffffffffda8,
               in_stack_fffffffffffffda0);
  }
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0x870831);
  for (local_168 = 0; local_168 < 4; local_168 = local_168 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,12,1,0,12,1>>::block<3,1>
              (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,(Index)in_stack_fffffffffffffd88)
    ;
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,3,1,false>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80)
    ;
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)in_stack_fffffffffffffd88,(value_type *)in_stack_fffffffffffffd80);
  }
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x8708ec);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x8708fb);
  for (local_200 = 0; local_208 = local_200, local_200 < 3; local_200 = local_200 + 1) {
    while (local_208 = local_208 + 1, local_208 < 4) {
      this_00 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                std::
                vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ::operator[](*(vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                               **)(in_RDI + 0x18),local_200);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[](*(vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     **)(in_RDI + 0x18),local_208);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                (this_00,in_stack_fffffffffffffda8);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd88,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_fffffffffffffd80);
      this_01 = local_160;
      in_stack_fffffffffffffda8 =
           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           std::
           vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ::operator[](this_01,local_200);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[](this_01,local_208);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                (this_00,in_stack_fffffffffffffda8);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd88,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_fffffffffffffd80);
      in_stack_fffffffffffffd98 =
           (DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)
           Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                     ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffd88
                      ,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       in_stack_fffffffffffffd80);
      RVar1 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
              dot<Eigen::Matrix<double,3,1,0,3,1>>
                        ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         in_stack_fffffffffffffd88,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         in_stack_fffffffffffffd80);
      in_stack_fffffffffffffd80 =
           (EigenBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_3,_1,_false>_> *)
           ((double)in_stack_fffffffffffffd98 - RVar1);
      in_stack_fffffffffffffd88 =
           (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_fffffffffffffd88,(Index)in_stack_fffffffffffffd80);
      *(EigenBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_3,_1,_false>_> **)
       in_stack_fffffffffffffd88 = in_stack_fffffffffffffd80;
    }
  }
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)in_stack_fffffffffffffd98);
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == _dim );
    assert( (unsigned int) fvec.size() == 6);

    Eigen::Matrix<double,12,1> solution = _a;
    for(size_t i = 0; i < _dim; i++)
      solution += x[i]*_V.col(12-_dim+i);

    points_t ccam;
    for(size_t i = 0; i<4; i++)
      ccam.push_back(solution.block<3,1>(i*3,0));

    Eigen::Vector3d diffw;
    Eigen::Vector3d diffc;
    size_t index = 0;

    for(size_t i = 0; i<3; i++)
    {
      for(size_t j = i+1; j < 4; j++)
      {
        diffw = _c[i]-_c[j];
        diffc = ccam[i]-ccam[j];
        fvec[index++] = diffw.dot(diffw)-diffc.dot(diffc);
      }
    }

    return 0;
  }